

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VmaSuballocation *
VmaBinaryFindSorted<VmaSuballocationOffsetGreater,VmaSuballocation*,VmaSuballocation>
          (VmaSuballocation **beg,VmaSuballocation **end,VmaSuballocation *value,
          VmaSuballocationOffsetGreater *cmp)

{
  VmaSuballocation *pVVar1;
  VmaSuballocation *pVVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pVVar2 = *beg;
  pVVar1 = *end;
  if ((long)pVVar1 - (long)pVVar2 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    uVar4 = (long)pVVar1 - (long)pVVar2 >> 5;
    do {
      uVar6 = uVar4 - uVar3 >> 1;
      uVar5 = uVar6 + uVar3;
      if (value->offset < pVVar2[uVar5].offset) {
        uVar3 = uVar3 + uVar6 + 1;
        uVar5 = uVar4;
      }
      uVar4 = uVar5;
    } while (uVar3 < uVar5);
  }
  pVVar2 = pVVar2 + uVar3;
  if ((pVVar2 != pVVar1) && (value->offset != pVVar2->offset)) {
    pVVar2 = pVVar1;
  }
  return pVVar2;
}

Assistant:

IterT VmaBinaryFindSorted(const IterT& beg, const IterT& end, const KeyT& value, const CmpLess& cmp)
{
    IterT it = VmaBinaryFindFirstNotLess<CmpLess, IterT, KeyT>(
        beg, end, value, cmp);
    if (it == end ||
        (!cmp(*it, value) && !cmp(value, *it)))
    {
        return it;
    }
    return end;
}